

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsValueRef
WScriptJsrt::BroadcastCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  RuntimeThreadData *pRVar1;
  JsErrorCode JVar2;
  RuntimeThreadLocalData *pRVar3;
  HANDLE pVVar4;
  PAL_FILE *pPVar5;
  _List_node_base *p_Var6;
  JsValueRef local_28;
  JsValueRef returnValue;
  
  local_28 = (JsValueRef)0x0;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_28);
  if ((1 < argumentCount) && (JVar2 == JsNoError)) {
    pRVar3 = GetRuntimeThreadLocalData();
    if (pRVar3->threadData != (RuntimeThreadData *)0x0) {
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetSharedArrayBufferContent)
                (arguments[1],&pRVar3->threadData->sharedContent);
      pVVar4 = CreateSemaphoreW((LPSECURITY_ATTRIBUTES)0x0,0,
                                (LONG)(pRVar3->threadData->children).
                                      super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>
                                      ._M_impl._M_node._M_size,(LPCWSTR)0x0);
      pRVar3->threadData->hSemaphore = pVVar4;
      pRVar1 = pRVar3->threadData;
      pVVar4 = pRVar1->hSemaphore;
      if (pVVar4 == (HANDLE)0x0) {
        pPVar5 = PAL_get_stderr(0);
        PAL_fwprintf(pPVar5,L"Couldn\'t create semaphore.\n");
        pPVar5 = PAL_get_stderr(0);
        PAL_fflush(pPVar5);
      }
      else {
        p_Var6 = (pRVar1->children).
                 super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>._M_impl
                 ._M_node.super__List_node_base._M_next;
        if (p_Var6 != (_List_node_base *)&pRVar1->children) {
          do {
            SetEvent((p_Var6[1]._M_next)->_M_prev);
            p_Var6 = p_Var6->_M_next;
          } while (p_Var6 != (_List_node_base *)&pRVar3->threadData->children);
          pVVar4 = pRVar3->threadData->hSemaphore;
        }
        WaitForSingleObject(pVVar4,0xffffffff);
        CloseHandle(pRVar3->threadData->hSemaphore);
        pRVar3->threadData->hSemaphore = (HANDLE)0xffffffffffffffff;
      }
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtReleaseSharedArrayBufferContentHandle)
                (pRVar3->threadData->sharedContent);
    }
  }
  return local_28;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::BroadcastCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            ChakraRTInterface::JsGetSharedArrayBufferContent(arguments[1], &threadData->sharedContent);

            LONG count = (LONG)threadData->children.size();
            threadData->hSemaphore = CreateSemaphore(NULL, 0, count, NULL);
            if (threadData->hSemaphore)
            {
                //Clang does not support "for each" yet
                for (auto i = threadData->children.begin(); i != threadData->children.end(); i++)
                {
                    auto child = *i;
                    SetEvent(child->hevntReceivedBroadcast);
                }

                WaitForSingleObject(threadData->hSemaphore, INFINITE);
                CloseHandle(threadData->hSemaphore);
                threadData->hSemaphore = INVALID_HANDLE_VALUE;
            }
            else
            {
                fwprintf(stderr, _u("Couldn't create semaphore.\n"));
                fflush(stderr);
            }

            ChakraRTInterface::JsReleaseSharedArrayBufferContentHandle(threadData->sharedContent);
        }
    }

Error:
    return returnValue;
}